

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderMaxPatchVertices::compareResults
          (TessellationShaderMaxPatchVertices *this,char *description,GLfloat *ref_fv)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  float *pfVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  bVar7 = false;
  pfVar4 = (float *)(**(code **)(lVar3 + 0xd00))(0x8c8e,0,0x20,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange(floats) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x296);
  fVar8 = *pfVar4 - *ref_fv;
  fVar9 = -fVar8;
  if (-fVar8 <= fVar8) {
    fVar9 = fVar8;
  }
  if (fVar9 <= 1e-05) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) {
        bVar7 = true;
        goto LAB_00d33f1c;
      }
      fVar8 = pfVar4[uVar5 + 2] - ref_fv[uVar5 + 2];
      fVar9 = -fVar8;
      if (-fVar8 <= fVar8) {
        fVar9 = fVar8;
      }
      uVar5 = uVar5 + 1;
    } while (fVar9 <= 1e-05);
    bVar7 = 2 < uVar5;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  local_1b0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (description == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar6 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,description,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," captured results ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
  std::ostream::_M_insert<double>((double)*pfVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)pfVar4[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)pfVar4[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)pfVar4[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"are different from the expected values ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
  std::ostream::_M_insert<double>((double)*ref_fv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)ref_fv[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)ref_fv[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)ref_fv[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00d33f1c:
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2af);
  return bVar7;
}

Assistant:

bool TessellationShaderMaxPatchVertices::compareResults(const char* description, glw::GLfloat ref_fv[4])
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	const glw::GLfloat*   resultFloats = DE_NULL;

	resultFloats = (const glw::GLfloat*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
		(sizeof(glw::GLfloat) /* GLfloat size */ * 4 /* components */ * OUTPUT_VERTEX_COUNT), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(floats) failed");

	/* Comparison of vec4. */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_failed = false;

	for (int i = 0; i < 4 /* components */; i++)
	{
		if (de::abs(resultFloats[i] - ref_fv[i]) > epsilon)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

			m_testCtx.getLog() << tcu::TestLog::Message << description << " captured results "
							   << "vec4(" << resultFloats[0] << ", " << resultFloats[1] << ", " << resultFloats[2]
							   << ", " << resultFloats[3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << ref_fv[0] << ", " << ref_fv[1] << ", " << ref_fv[2] << ", " << ref_fv[3]
							   << ")." << tcu::TestLog::EndMessage;

			test_failed = true;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return !test_failed;
}